

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::matchRange(CharScanner *this,int c1,int c2)

{
  int iVar1;
  undefined8 uVar2;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  CharScanner *in_stack_00000018;
  bool in_stack_00000023;
  int la_1;
  
  iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,1);
  if ((in_ESI <= iVar1) && (iVar1 <= in_EDX)) {
    (**(code **)(*in_RDI + 0x40))();
    return;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  MismatchedCharException::MismatchedCharException
            ((MismatchedCharException *)this,c1,c2,la_1,in_stack_00000023,in_stack_00000018);
  __cxa_throw(uVar2,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void matchRange(int c1, int c2)
	{
		int la_1 = LA(1);

		if ( la_1 < c1 || la_1 > c2 )
			throw MismatchedCharException(la_1, c1, c2, false, this);

		consume();
	}